

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O3

wchar_t tval_find_idx(char *name)

{
  _Bool _Var1;
  wchar_t wVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  char *pe;
  char newname [40];
  char *local_50;
  char local_48 [48];
  
  uVar3 = strtoul(name,&local_50,10);
  if (local_50 == name) {
    my_strcpy(local_48,name,0x28);
    pcVar4 = strstr(local_48,"armour");
    if (pcVar4 != (char *)0x0) {
      my_strcpy(pcVar4 + 4,"r",2);
    }
    pcVar4 = string_make(local_48);
    lVar5 = 8;
    do {
      wVar2 = my_stricmp(pcVar4,*(char **)((long)&tval_names[0].tval + lVar5));
      if (wVar2 == L'\0') {
        string_free(pcVar4);
        return *(wchar_t *)((long)&el_powers[0xc].im_power + lVar5);
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x248);
    string_free(pcVar4);
    wVar2 = L'\xffffffff';
  }
  else {
    _Var1 = contains_only_spaces(local_50);
    wVar2 = L'\xffffffff';
    if (uVar3 < 0x24) {
      wVar2 = (wchar_t)uVar3;
    }
    if (!_Var1) {
      wVar2 = L'\xffffffff';
    }
  }
  return wVar2;
}

Assistant:

int tval_find_idx(const char *name)
{
	size_t i;
	char *mod_name, *pe;
	unsigned long r = strtoul(name, &pe, 10);

	if (pe != name) {
		return (contains_only_spaces(pe) && r < TV_MAX) ? (int)r : -1;
	}

	mod_name = de_armour(name);

	for (i = 0; i < N_ELEMENTS(tval_names); i++) {
		if (!my_stricmp(mod_name, tval_names[i].name)) {
			string_free(mod_name);
			return tval_names[i].tval;
		}
	}

	string_free(mod_name);
	return -1;
}